

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::Clear(ImDrawList *this)

{
  ImDrawListFlags IVar1;
  
  IVar1 = 0;
  ImVector<ImDrawCmd>::resize(&this->CmdBuffer,0);
  ImVector<unsigned_short>::resize(&this->IdxBuffer,0);
  ImVector<ImDrawVert>::resize(&this->VtxBuffer,0);
  if (this->_Data != (ImDrawListSharedData *)0x0) {
    IVar1 = this->_Data->InitialFlags;
  }
  this->Flags = IVar1;
  this->_VtxCurrentOffset = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ImVector<ImVec4>::resize(&this->_ClipRectStack,0);
  ImVector<void_*>::resize(&this->_TextureIdStack,0);
  ImVector<ImVec2>::resize(&this->_Path,0);
  (this->_Splitter)._Current = 0;
  (this->_Splitter)._Count = 1;
  return;
}

Assistant:

void ImDrawList::Clear()
{
    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data ? _Data->InitialFlags : ImDrawListFlags_None;
    _VtxCurrentOffset = 0;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
}